

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O2

int ffgcll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp,
          char nulval,char *array,char *nularray,int *anynul,int *status)

{
  uchar uVar1;
  int iVar2;
  long lVar3;
  uchar *values;
  long lVar4;
  long nvals;
  LONGLONG elemnum;
  int local_71c4;
  int maxelem;
  int tcode;
  long local_71b8;
  fitsfile *local_71b0;
  LONGLONG repeat;
  long local_71a0;
  LONGLONG rowlen;
  LONGLONG startpos;
  long incre;
  int hdutype;
  double zero;
  double scale;
  LONGLONG tnull;
  long twidth;
  char snull [20];
  char tform [20];
  char message [81];
  uchar buffer [28800];
  
  iVar2 = *status;
  if (nelem != 0 && iVar2 < 1) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    local_71b0 = fptr;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    iVar2 = ffgcprll(local_71b0,colnum,firstrow,firstelem,nelem,0,&scale,&zero,tform,&twidth,&tcode,
                     &maxelem,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,status
                    );
    if (iVar2 < 1) {
      if (tcode == 0xe) {
        local_71b8 = 0;
        lVar4 = 0;
        local_71c4 = nultyp;
        while (nelem != 0) {
          lVar3 = (long)maxelem;
          if (nelem < maxelem) {
            lVar3 = nelem;
          }
          nvals = repeat - elemnum;
          if (lVar3 < repeat - elemnum) {
            nvals = lVar3;
          }
          values = buffer;
          local_71a0 = nelem;
          ffgi1b(local_71b0,elemnum * incre + rowlen * local_71b8 + startpos,nvals,incre,values,
                 status);
          lVar3 = 0;
          if (0 < nvals) {
            lVar3 = nvals;
          }
          while (lVar3 != 0) {
            uVar1 = *values;
            if (uVar1 == '\0') {
              array[lVar4] = nulval;
              if (anynul != (int *)0x0) {
                *anynul = 1;
              }
              if (local_71c4 == 2) {
                nularray[lVar4] = '\x01';
              }
            }
            else if (uVar1 == '\x01') {
              array[lVar4] = '1';
            }
            else if (uVar1 == 'F') {
              array[lVar4] = '\0';
            }
            else if (uVar1 == 'T') {
              array[lVar4] = '\x01';
            }
            else {
              array[lVar4] = uVar1;
            }
            lVar4 = lVar4 + 1;
            values = values + 1;
            lVar3 = lVar3 + -1;
          }
          if (0 < *status) {
            snprintf(message,0x51,
                     "Error reading elements %.0f thruough %.0f of logical array (ffgcl).",
                     (double)lVar4 + 1.0,(double)nvals + (double)lVar4);
            ffpmsg(message);
            return *status;
          }
          nelem = local_71a0 - nvals;
          if ((nelem != 0) && (elemnum = nvals + elemnum, elemnum == repeat)) {
            elemnum = 0;
            local_71b8 = local_71b8 + 1;
          }
        }
        iVar2 = *status;
      }
      else {
        *status = 0x136;
        iVar2 = 0x136;
      }
    }
    else {
      iVar2 = *status;
    }
  }
  return iVar2;
}

Assistant:

int ffgcll( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG  firstelem, /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char nulval,      /* I - value for null pixels if nultyp = 1     */
            char *array,      /* O - array of values                         */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of logical values from a column in the current FITS HDU.
*/
{
    double dtemp;
    int tcode, maxelem, hdutype, ii, nulcheck;
    long twidth, incre;
    long ntodo;
    LONGLONG repeat, startpos, elemnum, readptr, tnull, rowlen, rownum, remain, next;
    double scale, zero;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    unsigned char buffer[DBUFFSIZE], *buffptr;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    if (anynul)
       *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode != TLOGICAL)   
        return(*status = NOT_LOGICAL_COL);
 
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    /*---------------------------------------------------------------------*/
    /*  Now read the logical values from the FITS column.                  */
    /*---------------------------------------------------------------------*/

    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */
    ntodo = (long) remain;           /* max number of elements to read at one time */

    while (ntodo)
    {
      /*
         limit the number of pixels to read at one time to the number that
         remain in the current vector.    
      */
      ntodo = (long) minvalue(ntodo, maxelem);      
      ntodo = (long) minvalue(ntodo, (repeat - elemnum));

      readptr = startpos + (rowlen * rownum) + (elemnum * incre);

      ffgi1b(fptr, readptr, ntodo, incre, buffer, status);

      /* convert from T or F to 1 or 0 */
      buffptr = buffer;
      for (ii = 0; ii < ntodo; ii++, next++, buffptr++)
      {
        if (*buffptr == 'T')
          array[next] = 1;
        else if (*buffptr =='F') 
          array[next] = 0;
        else if (*buffptr == 0)
        {
          array[next] = nulval;  /* set null values to input nulval */
          if (anynul)
              *anynul = 1;

          if (nulcheck == 2)
          {
            nularray[next] = 1;  /* set null flags */
          }
        }
        else  /* some other illegal character; return the char value */
        {
          if (*buffptr == 1) {
            /* this is an unfortunate case where the illegal value is the same
               as what we set True values to, so set the value to the character '1'
               instead, which has ASCII value 49.  */
            array[next] = 49;
          } else {
            array[next] = (char) *buffptr;
          }
        }
      }

      if (*status > 0)  /* test for error during previous read operation */
      {
	dtemp = (double) next;
        snprintf(message,FLEN_ERRMSG,
          "Error reading elements %.0f thruough %.0f of logical array (ffgcl).",
           dtemp+1., dtemp + ntodo);
        ffpmsg(message);
        return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      remain -= ntodo;
      if (remain)
      {
        elemnum += ntodo;

        if (elemnum == repeat)  /* completed a row; start on later row */
          {
            elemnum = 0;
            rownum++;
          }
      }
      ntodo = (long) remain;  /* this is the maximum number to do in next loop */

    }  /*  End of main while Loop  */

    return(*status);
}